

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingBuffer.h
# Opt level: O0

uint __thiscall RingBuffer::ReadFromLittleEndian<unsigned_int>(RingBuffer *this)

{
  uint8_t *puVar1;
  ulong local_20;
  size_t i;
  uint result;
  RingBuffer *this_local;
  
  i._4_4_ = 0;
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    i._4_4_ = ((uint)*this->read << ((byte)(local_20 << 3) & 0x1f)) + i._4_4_;
    puVar1 = Increment(this,this->read,1);
    this->read = puVar1;
  }
  return i._4_4_;
}

Assistant:

T ReadFromLittleEndian()
    {
        T result = 0;
        for (size_t i = 0; i < sizeof(T); ++i) {
            result += (((T)(*read)) << (8 * i));
            read = Increment(read, 1);
        }
        return result;
    }